

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLDocument::~XMLDocument(XMLDocument *this)

{
  XMLDocument *this_local;
  
  (this->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_00261330;
  Clear(this);
  MemPoolT<104>::~MemPoolT(&this->_commentPool);
  MemPoolT<112>::~MemPoolT(&this->_textPool);
  MemPoolT<80>::~MemPoolT(&this->_attributePool);
  MemPoolT<120>::~MemPoolT(&this->_elementPool);
  DynArray<tinyxml2::XMLNode_*,_10>::~DynArray(&this->_unlinked);
  StrPair::~StrPair(&this->_errorStr);
  XMLNode::~XMLNode(&this->super_XMLNode);
  return;
}

Assistant:

XMLDocument::~XMLDocument()
{
    Clear();
}